

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * parse_call(Parser *parser)

{
  Token *name;
  List *list;
  void *data;
  ConstantTerm *expr;
  CallTerm *pCVar1;
  List *args;
  Token *token;
  Parser *parser_local;
  
  name = parser->token;
  list = new_list();
  move(parser);
  expect(parser,OP_BRA);
  while (parser->token->kind != CL_BRA) {
    data = parse_expr(parser);
    list_add(list,data);
    if (parser->token->kind == CL_BRA) break;
    move(parser);
    if (parser->token->kind == COMM) {
      move(parser);
    }
  }
  expect(parser,CL_BRA);
  expr = new_constant_term(name);
  pCVar1 = new_call_term(expr,list);
  return pCVar1;
}

Assistant:

void *parse_call(Parser *parser) {
    Token *token = token(parser);
    List *args = new_list();
    move(parser);
    expect(parser, OP_BRA);
    while (token(parser)->kind != CL_BRA) {
        list_add(args, parse_expr(parser));
        if (token(parser)->kind == CL_BRA)break;
        move(parser);
        if (token(parser)->kind == COMM)
            move(parser);
    }
    expect(parser, CL_BRA);
    return new_call_term(new_constant_term(token), args);
}